

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lmi_helper.c
# Opt level: O0

uint64_t helper_psubsh_mips64el(uint64_t fs,uint64_t ft)

{
  int local_38;
  undefined2 local_34;
  uint local_2c;
  int r;
  uint i;
  LMIValue vt;
  LMIValue vs;
  uint64_t ft_local;
  uint64_t fs_local;
  
  vt.d = fs;
  _r = ft;
  for (local_2c = 0; local_2c < 4; local_2c = local_2c + 1) {
    local_38 = (int)*(short *)((long)&vt + (ulong)local_2c * 2) -
               (int)*(short *)((long)&r + (ulong)local_2c * 2);
    if (local_38 < -0x8000) {
      local_34 = 0x8000;
    }
    else {
      if (0x7fff < local_38) {
        local_38 = 0x7fff;
      }
      local_34 = (undefined2)local_38;
    }
    *(undefined2 *)((long)&vt + (ulong)local_2c * 2) = local_34;
  }
  return vt.d;
}

Assistant:

uint64_t helper_psubsh(uint64_t fs, uint64_t ft)
{
    LMIValue vs, vt;
    unsigned int i;

    vs.d = fs;
    vt.d = ft;
    for (i = 0; i < 4; ++i) {
        int r = vs.sh[i] - vt.sh[i];
        vs.sh[i] = SATSH(r);
    }
    return vs.d;
}